

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-convert.cpp
# Opt level: O2

void test_convert<signed_char,float>(uint length,char value)

{
  float fVar1;
  char *__p;
  float *__p_00;
  undefined8 *puVar2;
  ulong uVar3;
  uint uVar4;
  float fVar5;
  char *local_48;
  shared_ptr<signed_char> pt;
  shared_ptr<float> pu;
  
  __p = nosimd::common::malloc<signed_char>(length);
  std::__shared_ptr<signed_char,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<signed_char,void(*)(signed_char*),void>
            ((__shared_ptr<signed_char,(__gnu_cxx::_Lock_policy)2> *)&local_48,__p,
             nosimd::common::free<signed_char>);
  __p_00 = nosimd::common::malloc<float>(length);
  std::__shared_ptr<float,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<float,void(*)(float*),void>
            ((__shared_ptr<float,(__gnu_cxx::_Lock_policy)2> *)
             &pt.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount,__p_00,
             nosimd::common::free<float>);
  nosimd::common::set<signed_char>(value,local_48,length);
  nosimd::common::convert<signed_char,float>
            (local_48,(float *)pt.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi,length);
  uVar3 = 0;
  do {
    if (length == uVar3) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pu);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pt);
      return;
    }
    fVar1 = *(float *)((long)&(pt.super___shared_ptr<signed_char,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi)->_vptr__Sp_counted_base + uVar3 * 4);
    fVar5 = fVar1 - (float)(int)value;
    uVar4 = -(uint)(fVar5 < 0.0);
    uVar3 = uVar3 + 1;
  } while ((float)(~uVar4 & (uint)fVar5 | (uint)((float)(int)value - fVar1) & uVar4) < 1.1920929e-07
          );
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar2 = "void test_convert(unsigned int, _T) [_T = signed char, _U = float]";
  *(undefined4 *)(puVar2 + 1) = 0x17;
  *(uint *)((long)puVar2 + 0xc) = length;
  __cxa_throw(puVar2,&Exception::typeinfo,0);
}

Assistant:

void test_convert(unsigned length, _T value)
{
    auto pt = std::shared_ptr<_T>(simd::malloc<_T>(length), simd::free<_T>);
    auto pu = std::shared_ptr<_U>(simd::malloc<_U>(length), simd::free<_U>);
    _T * t = pt.get();
    _U * u = pu.get();

    simd::set(value, t, length);
    simd::convert(t, u, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(u[i], (_U)value))
            FAIL();
    }
}